

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_wString __thiscall
ON_Font::Description
          (ON_Font *this,NameLocale name_local,wchar_t family_separator,
          wchar_t weight_width_slope_separator,bool bIncludeUndelinedAndStrikethrough,
          bool bIncludeNotOnDevice)

{
  bool bVar1;
  undefined7 in_register_00000031;
  int *piVar2;
  ON_wString *pOVar3;
  ON_wString wws;
  ON_wString family_name;
  ON_wString logfont_name;
  undefined1 local_40 [32];
  
  piVar2 = (int *)CONCAT71(in_register_00000031,name_local);
  ON_wString::ON_wString((ON_wString *)this);
  if ((((char)wws.m_s != '\0') && (*piVar2 != 0)) &&
     (((uint)*(undefined8 *)(piVar2 + 0x2e) & 3) == 2)) {
    ON_wString::ON_wString((ON_wString *)(local_40 + 0x10),L"[Not on device] ");
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 0x10));
    ON_wString::~ON_wString((ON_wString *)(local_40 + 0x10));
  }
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)(piVar2 + 0xe));
  pOVar3 = (ON_wString *)(piVar2 + 0x10);
  if (bVar1) {
    pOVar3 = (ON_wString *)(piVar2 + 0xe);
  }
  ON_wString::ON_wString((ON_wString *)(local_40 + 0x10),pOVar3);
  ON_wString::TrimLeftAndRight((ON_wString *)(local_40 + 0x10),(wchar_t *)0x0);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)(piVar2 + 0x16));
  pOVar3 = (ON_wString *)(piVar2 + 0x18);
  if (bVar1) {
    pOVar3 = (ON_wString *)(piVar2 + 0x16);
  }
  ON_wString::ON_wString((ON_wString *)(local_40 + 0x18),pOVar3);
  ON_wString::TrimLeftAndRight((ON_wString *)(local_40 + 0x18),(wchar_t *)0x0);
  bVar1 = ON_wString::IsEmpty((ON_wString *)(local_40 + 0x10));
  if (bVar1) {
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)(local_40 + 0x18));
    if (!bVar1) goto LAB_00488600;
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 0x18));
    WidthWeightSlantDescription
              ((ON_Font *)local_40,*(Stretch *)((long)piVar2 + 0x1a),*(Weight *)(piVar2 + 6),
               *(Style *)((long)piVar2 + 0x19));
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_40);
    if (bVar1) {
      ON_wString::ON_wString((ON_wString *)(local_40 + 8),L" (");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 8));
      ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
      ON_wString::ON_wString((ON_wString *)(local_40 + 8),L")");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 8));
      ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
    }
  }
  else {
LAB_00488600:
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)(local_40 + 0x10));
    if (bVar1) {
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 0x10));
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)(piVar2 + 0x12));
      pOVar3 = (ON_wString *)(piVar2 + 0x14);
      if (bVar1) {
        pOVar3 = (ON_wString *)(piVar2 + 0x12);
      }
      ON_wString::ON_wString((ON_wString *)local_40,pOVar3);
      ON_wString::TrimLeftAndRight((ON_wString *)local_40,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_40);
      if (bVar1) {
        ON_wString::ON_wString((ON_wString *)(local_40 + 8),L" ");
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)(local_40 + 8));
        ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
      }
    }
    else {
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)(piVar2 + 10));
      pOVar3 = (ON_wString *)(piVar2 + 0xc);
      if (bVar1) {
        pOVar3 = (ON_wString *)(piVar2 + 10);
      }
      ON_wString::ON_wString((ON_wString *)local_40,pOVar3);
      ON_wString::TrimLeftAndRight((ON_wString *)local_40,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_40);
      if (bVar1) {
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
      }
    }
  }
  ON_wString::~ON_wString((ON_wString *)local_40);
  bVar1 = ON_wString::IsEmpty((ON_wString *)this);
  if (bVar1) {
    WidthWeightSlantDescription
              ((ON_Font *)local_40,*(Stretch *)((long)piVar2 + 0x1a),*(Weight *)(piVar2 + 6),
               *(Style *)((long)piVar2 + 0x19));
    ON_wString::operator=((ON_wString *)this,(ON_wString *)local_40);
    ON_wString::~ON_wString((ON_wString *)local_40);
  }
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar1) {
    if ((*(byte *)((long)piVar2 + 0x1b) & *(byte *)(piVar2 + 7)) == 1) {
      ON_wString::ON_wString((ON_wString *)local_40,L" (underlined,strikethrough)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
    }
    else if (*(byte *)((long)piVar2 + 0x1b) == 0) {
      if (*(byte *)(piVar2 + 7) == 0) goto LAB_004887aa;
      ON_wString::ON_wString((ON_wString *)local_40,L" (strikethrough)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
    }
    else {
      ON_wString::ON_wString((ON_wString *)local_40,L" (underlined)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_40);
    }
    ON_wString::~ON_wString((ON_wString *)local_40);
  }
LAB_004887aa:
  ON_wString::~ON_wString((ON_wString *)(local_40 + 0x18));
  ON_wString::~ON_wString((ON_wString *)(local_40 + 0x10));
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Font::Description(
  ON_Font::NameLocale name_local,
  wchar_t family_separator,
  wchar_t weight_width_slope_separator,
  bool bIncludeUndelinedAndStrikethrough,
  bool bIncludeNotOnDevice
) const
{
  ON_wString description;

  if (bIncludeNotOnDevice && this->IsManagedSubstitutedFont())
  {
    description += ON_wString(L"[Not on device] ");
  }

  ON_wString family_name = FamilyName();
  family_name.TrimLeftAndRight();
  ON_wString logfont_name = WindowsLogfontName();
  logfont_name.TrimLeftAndRight();
  if (family_name.IsEmpty() && logfont_name.IsNotEmpty())
  {
    // LOGFONT (width-weight-slant)
    description += logfont_name;

    const ON_wString wws = this->WidthWeightSlantDescription();
    if (wws.IsNotEmpty())
    {
      description += ON_wString(L" (");
      description += wws;
      description += ON_wString(L")");
    }
  }
  else if (family_name.IsNotEmpty() )
  {
    // family face
    description += family_name;
    ON_wString face_name = FaceName();
    face_name.TrimLeftAndRight();
    if ( face_name.IsNotEmpty() )
    {
      description += ON_wString(L" ");
      description += face_name;
    }
  }
  else
  {
    ON_wString postscript_name = PostScriptName();
    postscript_name.TrimLeftAndRight();
    if (postscript_name.IsNotEmpty())
      description += postscript_name;
  }

  if (description.IsEmpty())
    description = this->WidthWeightSlantDescription();

  if (description.IsNotEmpty())
  {
    const bool bUnderlined = IsUnderlined();
    const bool bStrikethrough = IsStrikethrough();
    if (bUnderlined && bStrikethrough)
      description += ON_wString(L" (underlined,strikethrough)");
    else if (bUnderlined)
      description += ON_wString(L" (underlined)");
    else if (bStrikethrough)
      description += ON_wString(L" (strikethrough)");
  }

  return description;
}